

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSendAction(UpnpClient_Handle Hnd,char *ActionURL_const,char *ServiceType_const,
                  char *DevUDN_const,IXML_Document *Action,IXML_Document **RespNodePtr)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  char *ServiceType;
  char *ActionURL;
  Handle_Info *pHStack_40;
  int retVal;
  Handle_Info *SInfo;
  IXML_Document **RespNodePtr_local;
  IXML_Document *Action_local;
  char *DevUDN_const_local;
  char *ServiceType_const_local;
  char *ActionURL_const_local;
  UpnpClient_Handle Hnd_local;
  
  pHStack_40 = (Handle_Info *)0x0;
  if (UpnpSdkInit == 1) {
    SInfo = (Handle_Info *)RespNodePtr;
    RespNodePtr_local = (IXML_Document **)Action;
    Action_local = (IXML_Document *)DevUDN_const;
    DevUDN_const_local = ServiceType_const;
    ServiceType_const_local = ActionURL_const;
    ActionURL_const_local._0_4_ = Hnd;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xb4a,"Inside UpnpSendAction\n");
    if (Action_local != (IXML_Document *)0x0) {
      UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xb4f,"non NULL DevUDN is ignored\n");
    }
    Action_local = (IXML_Document *)0x0;
    HandleReadLock(".upnp/src/api/upnpapi.c",0xb54);
    UVar1 = GetHandleInfo((UpnpClient_Handle)ActionURL_const_local,&stack0xffffffffffffffc0);
    if (UVar1 == HND_CLIENT) {
      HandleUnlock(".upnp/src/api/upnpapi.c",0xb5c);
      if (ActionURL_const == (char *)0x0) {
        ActionURL_const_local._4_4_ = -0x65;
      }
      else if ((((ServiceType_const == (char *)0x0) || (RespNodePtr_local == (IXML_Document **)0x0))
               || (SInfo == (Handle_Info *)0x0)) || (Action_local != (IXML_Document *)0x0)) {
        ActionURL_const_local._4_4_ = -0x65;
      }
      else {
        iVar2 = SoapSendAction(ActionURL_const,ServiceType_const,(IXML_Document *)RespNodePtr_local,
                               (IXML_Document **)SInfo);
        UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xb6b,"Exiting UpnpSendAction\n");
        ActionURL_const_local._4_4_ = iVar2;
      }
    }
    else {
      HandleUnlock(".upnp/src/api/upnpapi.c",0xb59);
      ActionURL_const_local._4_4_ = -100;
    }
  }
  else {
    ActionURL_const_local._4_4_ = -0x74;
  }
  return ActionURL_const_local._4_4_;
}

Assistant:

int UpnpSendAction(UpnpClient_Handle Hnd,
	const char *ActionURL_const,
	const char *ServiceType_const,
	const char *DevUDN_const,
	IXML_Document *Action,
	IXML_Document **RespNodePtr)
{
	struct Handle_Info *SInfo = NULL;
	int retVal = 0;
	char *ActionURL = (char *)ActionURL_const;
	char *ServiceType = (char *)ServiceType_const;
	/* udn not used? */
	/*char *DevUDN = (char *)DevUDN_const;*/

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(
		UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpSendAction\n");
	if (DevUDN_const != NULL) {
		UpnpPrintf(UPNP_ALL,
			API,
			__FILE__,
			__LINE__,
			"non NULL DevUDN is ignored\n");
	}
	DevUDN_const = NULL;

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	HandleUnlock(__FILE__, __LINE__);

	if (ActionURL == NULL) {
		return UPNP_E_INVALID_PARAM;
	}

	if (ServiceType == NULL || Action == NULL || RespNodePtr == NULL ||
		DevUDN_const != NULL) {

		return UPNP_E_INVALID_PARAM;
	}

	retVal = SoapSendAction(ActionURL, ServiceType, Action, RespNodePtr);

	UpnpPrintf(
		UPNP_ALL, API, __FILE__, __LINE__, "Exiting UpnpSendAction\n");

	return retVal;
}